

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

void ** CP_consolidateDataToAll
                  (SstStream Stream,void *LocalInfo,FFSTypeHandle Type,void **RetDataBlock)

{
  int iVar1;
  FFSContext p_Var2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  void *sendbuf;
  size_t *recvcounts;
  size_t *displs;
  long lVar6;
  void *recvbuf;
  void **ppvVar7;
  uint uVar8;
  void **ppvVar9;
  ulong uVar10;
  size_t DataSize;
  
  uVar4 = create_FFSBuffer();
  uVar5 = FMFormat_of_original(Type);
  sendbuf = (void *)FFSencode(uVar4,uVar5,LocalInfo,&DataSize);
  recvcounts = (size_t *)malloc((long)Stream->CohortSize << 3);
  SMPI_Allgather(&DataSize,1,SMPI_SIZE_T,recvcounts,1,SMPI_SIZE_T,Stream->mpiComm);
  iVar1 = Stream->CohortSize;
  displs = (size_t *)malloc((long)iVar1 * 8);
  *displs = 0;
  uVar8 = (int)*recvcounts + 7U & 0xfffffff8;
  for (lVar6 = 1; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    sVar3 = recvcounts[lVar6];
    displs[lVar6] = (long)(int)uVar8;
    uVar8 = uVar8 + ((int)sVar3 + 7U & 0xfffffff8);
  }
  recvbuf = malloc((long)(int)uVar8);
  SMPI_Allgatherv(sendbuf,(int)DataSize,SMPI_CHAR,recvbuf,recvcounts,displs,SMPI_CHAR,
                  Stream->mpiComm);
  free_FFSBuffer(uVar4);
  p_Var2 = Stream->CPInfo->ffs_c;
  uVar10 = (ulong)Stream->CohortSize;
  ppvVar7 = (void **)malloc(uVar10 << 3);
  ppvVar9 = ppvVar7;
  for (lVar6 = 0; lVar6 < (int)uVar10; lVar6 = lVar6 + 1) {
    FFSdecode_in_place(p_Var2,displs[lVar6] + (long)recvbuf,ppvVar9);
    uVar10 = (ulong)(uint)Stream->CohortSize;
    ppvVar9 = ppvVar9 + 1;
  }
  free(displs);
  free(recvcounts);
  *RetDataBlock = recvbuf;
  return ppvVar7;
}

Assistant:

void **CP_consolidateDataToAll(SstStream Stream, void *LocalInfo, FFSTypeHandle Type,
                               void **RetDataBlock)
{
    FFSBuffer Buf = create_FFSBuffer();
    size_t DataSize;
    size_t *RecvCounts;
    char *Buffer;

    struct _CP_DP_init_info **Pointers = NULL;

    Buffer = FFSencode(Buf, FMFormat_of_original(Type), LocalInfo, &DataSize);

    RecvCounts = malloc(Stream->CohortSize * sizeof(*RecvCounts));

    SMPI_Allgather(&DataSize, 1, SMPI_SIZE_T, RecvCounts, 1, SMPI_SIZE_T, Stream->mpiComm);

    /*
     * Figure out the total length of block
     * and displacements for each rank
     */

    size_t *Displs;
    char *RecvBuffer = NULL;
    int i;

    int TotalLen = 0;
    Displs = malloc(Stream->CohortSize * sizeof(*Displs));

    Displs[0] = 0;
    TotalLen = (RecvCounts[0] + 7) & ~7;

    for (i = 1; i < Stream->CohortSize; i++)
    {
        int round_up = (RecvCounts[i] + 7) & ~7;
        Displs[i] = TotalLen;
        TotalLen += round_up;
    }

    RecvBuffer = malloc(TotalLen * sizeof(char));

    /*
     * Now we have the receive Buffer, counts, and displacements, and
     * can gather the data
     */

    SMPI_Allgatherv(Buffer, (int)DataSize, SMPI_CHAR, RecvBuffer, RecvCounts, Displs, SMPI_CHAR,
                    Stream->mpiComm);
    free_FFSBuffer(Buf);

    FFSContext context = Stream->CPInfo->ffs_c;

    Pointers = malloc(Stream->CohortSize * sizeof(Pointers[0]));
    for (i = 0; i < Stream->CohortSize; i++)
    {
        FFSdecode_in_place(context, RecvBuffer + Displs[i], (void **)&Pointers[i]);
    }
    free(Displs);
    free(RecvCounts);

    *RetDataBlock = RecvBuffer;
    return (void **)Pointers;
}